

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O2

void __thiscall
P2Pt::pose_poly<double>::rhos_from_root_ids
          (pose_poly<double> *this,double (*root_ids) [1899],double (*out) [3] [1899],
          uint *out_ts_len)

{
  uint uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  int iVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM5_Qb;
  undefined1 auVar17 [16];
  double local_48;
  
  *out_ts_len = 0;
  lVar6 = 0;
LAB_00111638:
  while( true ) {
    if (lVar6 == 0x76b) {
      dVar7 = this->alpha;
      uVar1 = *out_ts_len;
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        dVar8 = (*out)[0][uVar4];
        auVar17._8_8_ = 0;
        auVar17._0_8_ = this->beta;
        dVar2 = (dVar7 + dVar7) * dVar8;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar8 * dVar8;
        auVar15 = vfnmadd213sd_fma(auVar17,auVar15,auVar17);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = this->sth;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar2 * this->cth;
        auVar11 = vfmadd231sd_fma(auVar16,auVar15,auVar11);
        dVar8 = 1.0 / (dVar8 * dVar8 + 1.0);
        (*out)[1][uVar4] = auVar11._0_8_ * dVar8;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = this->cth;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar2 * this->sth;
        auVar11 = vfmsub231sd_fma(auVar12,auVar15,auVar3);
        (*out)[2][uVar4] = auVar11._0_8_ * dVar8;
      }
      return;
    }
    if ((*root_ids)[lVar6] != 0.0) break;
    lVar6 = lVar6 + 1;
  }
  auVar10._0_8_ = (double)(int)lVar6;
  auVar10._8_8_ = in_XMM5_Qb;
  auVar11 = vfmadd213sd_fma(auVar10,ZEXT816(0x3f513f0e8d344724),ZEXT816(0xbff0000000000000));
  lVar6 = lVar6 + 1;
  auVar14._0_8_ = (double)(int)lVar6;
  auVar14._8_8_ = in_XMM5_Qb;
  auVar3 = vfmadd213sd_fma(auVar14,ZEXT816(0x3f513f0e8d344724),ZEXT816(0xbff0000000000000));
  uVar1 = *out_ts_len;
  *out_ts_len = uVar1 + 1;
  local_48 = auVar11._0_8_;
  dVar7 = fn_t(this,local_48);
  auVar13 = ZEXT864(auVar3._0_8_);
  iVar5 = 0;
  do {
    dVar8 = fn_t(this,auVar13._0_8_);
    auVar13 = ZEXT864((ulong)auVar13._0_8_);
    auVar9 = ZEXT864((ulong)local_48);
    do {
      if (iVar5 == 3) goto LAB_00111638;
      auVar11 = auVar13._0_16_;
      local_48 = auVar13._0_8_;
      dVar7 = local_48 + ((auVar9._0_8_ - local_48) * dVar8) / (dVar8 - dVar7);
      auVar13 = ZEXT864((ulong)dVar7);
      (*out)[0][uVar1] = dVar7;
      iVar5 = iVar5 + 1;
      auVar9 = ZEXT1664(auVar11);
      dVar7 = dVar8;
    } while (iVar5 == 3);
  } while( true );
}

Assistant:

inline void rhos_from_root_ids(
      const T (&root_ids)[ROOT_IDS_LEN], T (*out)[3][ROOT_IDS_LEN], unsigned *out_ts_len) { 
    T (&ts)[ROOT_IDS_LEN] = (*out)[0];
    unsigned &ts_end = *out_ts_len; ts_end = 0;
    for (unsigned i = 0; i < ROOT_IDS_LEN; i++) {
      if (!root_ids[i]) continue;
      T t0 = t_vec(i), t1 = t_vec(i+1), &t2 = ts[ts_end++];
      T f0 = fn_t(t_vec(i)), f1 = fn_t(t_vec(i+1));
      for (unsigned k = 0; k < 3; ++k) {
        t2 = t1 - f1*(t1-t0)/(f1-f0); t0 = t1; t1 = t2;
        f0 = f1; if (k + 1 < 3) f1 = fn_t(t2);
      }
    }
    //% Each root is now ts(i), plus minus t_stddev. Now get rho1(t):
    T (&rhos1)[ROOT_IDS_LEN] = (*out)[1]; T (&rhos2)[ROOT_IDS_LEN] = (*out)[2];
    const T alpha_times_2 = 2.*alpha;
    for (unsigned i = 0; i < ts_end; i++) {
      const T ts_new = ts[i],
      x2 = ts_new * ts_new,
      ts_den = 1. + x2,
      alpha_ts_new2 = alpha_times_2 * ts_new,
      beta_1_minus_x2 = beta * (1. - x2);
      rhos1[i] = ( alpha_ts_new2 * cth + beta_1_minus_x2 * sth) / ts_den;
      rhos2[i] = (-alpha_ts_new2 * sth + beta_1_minus_x2 * cth) / ts_den;
    }
  }